

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

int trompeloeil::trace_return<int,CATCH2_INTERNAL_TEST_1()::__2,std::tuple<int&>,void>
              (trace_agent *agent,anon_class_1_0_00000001_for_func *func,tuple<int_&> *params)

{
  int iVar1;
  int local_24;
  tuple<int_&> *local_20;
  tuple<int_&> *params_local;
  anon_class_1_0_00000001_for_func *func_local;
  trace_agent *agent_local;
  
  local_20 = params;
  params_local = (tuple<int_&> *)func;
  func_local = (anon_class_1_0_00000001_for_func *)agent;
  local_24 = CATCH2_INTERNAL_TEST_1()::$_2::operator()((__2 *)func,params);
  iVar1 = trace_agent::trace_return<int>(agent,&local_24);
  return iVar1;
}

Assistant:

Ret
  trace_return(
    trace_agent& agent,
    F& func,
    P& params)
  {
    /* Work around VS 2017 15.7.x C4702 warning by
     * enclosing the operation in an otherwise
     * unnecessary try/catch block.
     */
    try
    {
      return agent.trace_return(func(params));
    }
    catch (...)
    {
      throw;
    }
  }